

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_reshape(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  void *in_stack_00000130;
  int *in_stack_00000138;
  int in_stack_00000140;
  ggml_type in_stack_00000144;
  ggml_context *in_stack_00000148;
  
  _Var1 = ggml_is_contiguous(in_RSI);
  if (!_Var1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xebb,
            "ggml_is_contiguous(a)");
    abort();
  }
  _Var1 = ggml_is_contiguous(in_RDX);
  if (!_Var1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xebc,
            "ggml_is_contiguous(b)");
    abort();
  }
  iVar2 = ggml_nelements(in_RSI);
  iVar3 = ggml_nelements(in_RDX);
  if (iVar2 != iVar3) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xebd,
            "ggml_nelements(a) == ggml_nelements(b)");
    abort();
  }
  if ((in_RSI->grad == (ggml_tensor *)0x0) && (in_RDX->grad == (ggml_tensor *)0x0)) {
    pgVar4 = ggml_new_tensor_impl
                       (in_stack_00000148,in_stack_00000144,in_stack_00000140,in_stack_00000138,
                        in_stack_00000130);
    pgVar4->op = GGML_OP_RESHAPE;
    pgVar4->grad = (ggml_tensor *)0x0;
    pgVar4->src0 = in_RSI;
    pgVar4->src1 = (ggml_tensor *)0x0;
    return pgVar4;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xec2,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_reshape(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(b));
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, b->n_dims, b->ne, a->data);

    result->op   = GGML_OP_RESHAPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}